

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O3

int make_vbap_2d(vbap_data *data)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int j;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float azimuth [33];
  int sorted [33];
  float local_148 [36];
  int local_b8;
  mixed_channel_t local_b4 [132];
  
  bVar1 = data->speaker_count;
  if (bVar1 == 0) {
    iVar3 = 0;
    uVar6 = 0xffffffff;
  }
  else {
    uVar5 = (uint)bVar1;
    uVar10 = (ulong)uVar5;
    pfVar8 = data->speakers[0] + 2;
    uVar9 = 0;
    do {
      dVar12 = acos((double)(*(float (*) [3])(pfVar8 + -2))[0]);
      fVar11 = (float)((dVar12 * 360.0) / 6.283185307179586);
      local_148[uVar9] = fVar11;
      fVar13 = *pfVar8;
      if (0.001 <= ABS(fVar13) && ABS(fVar13) != 0.001) {
        local_148[uVar9] = fVar11 * (fVar13 / ABS(fVar13));
      }
      uVar9 = uVar9 + 1;
      pfVar8 = pfVar8 + 3;
    } while (uVar10 != uVar9);
    uVar6 = 0xffffffff;
    if ((ulong)uVar5 != 0) {
      uVar9 = 0;
      do {
        uVar7 = 0;
        uVar4 = 0;
        fVar13 = 1024.0;
        do {
          if (local_148[uVar7] < fVar13) {
            uVar4 = uVar7 & 0xffffffff;
            fVar13 = local_148[uVar7];
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
        iVar3 = (int)uVar4;
        *(int *)(local_b4 + uVar9 * 4 + -4) = iVar3;
        local_148[iVar3] = local_148[iVar3] + 2048.0;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
      if (uVar5 != 0) {
        uVar9 = 0;
        do {
          local_148[uVar9] = local_148[uVar9] + -2048.0;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        uVar6 = bVar1 - 1;
        if (uVar5 == 1) {
          iVar3 = 0;
        }
        else {
          uVar9 = 0;
          iVar3 = 0;
          do {
            fVar13 = local_148[uVar9 + 1];
            if (fVar13 - local_148[0] <= 170.0) {
              data->sets[iVar3].speakers[0] = local_b4[uVar9 * 4 + -4];
              data->sets[iVar3].speakers[1] = local_b4[uVar9 * 4];
              data->sets[iVar3].speakers[2] = 0xff;
              iVar2 = compute_set_matrix_2d(iVar3,local_148,data);
              iVar3 = iVar2 + iVar3;
            }
            uVar9 = uVar9 + 1;
            local_148[0] = fVar13;
          } while (uVar6 != uVar9);
        }
        goto LAB_0012aabc;
      }
    }
    iVar3 = 0;
  }
LAB_0012aabc:
  if ((360.0 - local_148[*(int *)(local_b4 + (long)(int)uVar6 * 4 + -4)]) + local_148[local_b8] <=
      170.0) {
    data->sets[iVar3].speakers[0] = (mixed_channel_t)*(int *)(local_b4 + (long)(int)uVar6 * 4 + -4);
    data->sets[iVar3].speakers[1] = (mixed_channel_t)local_b8;
    data->sets[iVar3].speakers[2] = 0xff;
    iVar2 = compute_set_matrix_2d(iVar3,local_148,data);
    iVar3 = iVar2 + iVar3;
  }
  if (iVar3 == 0) {
    mixed_err(8);
  }
  else {
    data->set_count = iVar3;
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int make_vbap_2d(struct vbap_data *data){
  mixed_channel_t speaker_count = data->speaker_count;
  int set_count = 0;

  // Get azimuth angles in [-180, +180]
  float azimuth[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] = acos(data->speakers[i][0]) * RAD2DEG;
    if(0.001 < fabs(data->speakers[i][2])){
      azimuth[i] *= data->speakers[i][2] / fabs(data->speakers[i][2]);
    }
  }
  
  // Sort the speakers by angle
  int sorted[MIXED_MAX_SPEAKER_COUNT];
  for(int i=0; i<speaker_count; ++i){
    float smallest_angle = 1024.0;
    int smallest = 0;
    for(int j=0; j<speaker_count; ++j){
      if(azimuth[j] < smallest_angle){
        smallest_angle = azimuth[j];
        smallest = j;
      }
    }
    sorted[i] = smallest;
    // Bias this one to not get picked again.
    azimuth[smallest] += 2048.0;
  }
  // Undo the bias.
  for(int i=0; i<speaker_count; ++i){
    azimuth[i] -= 2048.0;
  }

  // Construct pairs based on adjacent speakers
  for(int i=0; i<speaker_count-1; ++i){
    if(azimuth[i+1] - azimuth[i] <= (170)){
      data->sets[set_count].speakers[0] = sorted[i];
      data->sets[set_count].speakers[1] = sorted[i+1];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
    }
  }
  if(360 - azimuth[sorted[speaker_count-1]] + azimuth[sorted[0]] <= 170){
      data->sets[set_count].speakers[0] = sorted[speaker_count-1];
      data->sets[set_count].speakers[1] = sorted[0];
      data->sets[set_count].speakers[2] = -1;
      if(compute_set_matrix_2d(set_count, azimuth, data)){
        ++set_count;
      }
  }

  if(set_count == 0){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }
  
  data->set_count = set_count;
  return 1;
}